

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void bfgs_factored(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf)

{
  bool bVar1;
  double *C;
  double *C_00;
  double *C_01;
  double *C_02;
  double *A;
  double *v;
  double dVar2;
  double dVar3;
  double dVar4;
  double *u;
  double *t;
  double *temp2;
  double *temp;
  double *yk;
  double *sk;
  double temp3;
  double alpha;
  double jacm;
  double yt;
  double fd;
  double yn;
  double sn;
  int ct;
  int supd;
  int j;
  int i;
  double *jacf_local;
  double *jac_local;
  double *xf_local;
  double *xi_local;
  double eps_local;
  int N_local;
  double *H_local;
  
  C = (double *)malloc((long)N << 3);
  C_00 = (double *)malloc((long)N << 3);
  C_01 = (double *)malloc(8);
  C_02 = (double *)malloc(8);
  A = (double *)malloc((long)N << 3);
  v = (double *)malloc((long)N << 3);
  msub(xf,xi,C,1,N);
  msub(jacf,jac,C_00,1,N);
  dVar2 = l2norm(C,N);
  dVar3 = l2norm(C_00,N);
  dVar4 = sqrt(eps);
  mmult(C_00,C,C_01,1,N,1);
  if (dVar4 * dVar2 * dVar3 <= *C_01) {
    for (supd = 0; supd < N; supd = supd + 1) {
      A[supd] = 0.0;
      for (ct = supd; ct < N; ct = ct + 1) {
        A[supd] = H[ct * N + supd] * C[ct] + A[supd];
      }
    }
    mmult(A,A,C_02,1,N,1);
    dVar2 = sqrt(*C_01 / *C_02);
    bVar1 = true;
    for (supd = 0; supd < N; supd = supd + 1) {
      sk = (double *)0x0;
      for (ct = 0; ct < supd + 1; ct = ct + 1) {
        sk = (double *)(H[supd * N + ct] * A[ct] + (double)sk);
      }
      if (jac[supd] < jacf[supd] || jac[supd] == jacf[supd]) {
        alpha = jacf[supd];
      }
      else {
        alpha = jac[supd];
      }
      if (dVar4 * alpha <= ABS(C_00[supd] - (double)sk)) {
        bVar1 = false;
      }
      v[supd] = -dVar2 * (double)sk + C_00[supd];
    }
    if (!bVar1) {
      dVar2 = sqrt(*C_01 * *C_02);
      for (supd = 0; supd < N; supd = supd + 1) {
        A[supd] = (1.0 / dVar2) * A[supd];
      }
      for (supd = 1; supd < N; supd = supd + 1) {
        for (ct = 0; ct < supd; ct = ct + 1) {
          H[ct * N + supd] = H[supd * N + ct];
        }
      }
      qrupdate(H,N,A,v);
      for (supd = 1; supd < N; supd = supd + 1) {
        for (ct = 0; ct < supd; ct = ct + 1) {
          H[supd * N + ct] = H[ct * N + supd];
        }
      }
    }
  }
  free(C);
  free(C_00);
  free(C_01);
  free(C_02);
  free(A);
  free(v);
  return;
}

Assistant:

void bfgs_factored(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf) {
	int i,j,supd,ct;
	double sn,yn,fd,yt,jacm,alpha,temp3;
	double *sk,*yk,*temp,*temp2,*t,*u;
	
	sk = (double*) malloc(sizeof(double) *N);
	yk = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp2 = (double*) malloc(sizeof(double) *1);
	t = (double*) malloc(sizeof(double) *N);
	u = (double*) malloc(sizeof(double) *N);
	
	msub(xf,xi,sk,1,N);
	msub(jacf,jac,yk,1,N);
	
	sn = l2norm(sk,N);
	yn = l2norm(yk,N);
	fd = sqrt(eps);
	
	mmult(yk,sk,temp,1,N,1);
	
	if (temp[0] >= fd*sn*yn) {
		for(i = 0; i < N;++i) {
			t[i] = 0.0;
			for(j = i; j < N;++j) {
				ct = j * N;
				t[i] += H[ct + i] * sk[j];
			}
		}
		mmult(t,t,temp2,1,N,1);
		alpha = sqrt(temp[0]/temp2[0]);
		supd = 1;
		for(i = 0; i < N;++i) {
			temp3 = 0.0;
			ct = i * N;
			for(j = 0; j < i+1;++j) {
				temp3 += H[ct + j] * t[j];
			}
			yt = fabs(yk[i] - temp3);
			if (jac[i] > jacf[i]) {
				jacm = jac[i];
			} else {
				jacm = jacf[i];
			}
			if (yt >= fd * jacm) {
				supd = 0;
			}
			u[i] = yk[i] - alpha*temp3;
		}
		if (supd == 0) {
			temp3 = 1.0 / sqrt(temp[0] * temp2[0]);
			for(i = 0; i < N; ++i) {
				t[i] *= temp3;
			}
			for(i = 1; i < N; ++i) {
				ct = i *N;
				for(j = 0; j < i;++j) {
					H[j*N+i] = H[ct+j];
				}
			}
			qrupdate(H,N,t,u);
			for(i = 1; i < N; ++i) {
				ct = i *N;
				for(j = 0; j < i;++j) {
					H[ct+j] = H[j*N+i];
				}
			}
		} 
	} 
	
	free(sk);
	free(yk);
	free(temp);
	free(temp2);
	free(t);
	free(u);
}